

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
::dealloc(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
          *this)

{
  void *p;
  size_t n;
  
  if ((this->settings_).
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
      capacity_ != 0) {
    CommonFields::infoz((CommonFields *)this);
    p = CommonFields::backing_array_start((CommonFields *)this);
    n = CommonFields::alloc_size((CommonFields *)this,0x20,8);
    Deallocate<8ul,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
              ((allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>
                *)this,p,n);
    return;
  }
  __assert_fail("(capacity() != 0) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe4f,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>, absl::hash_internal::Hash<std::pair<const void *, std::basic_string_view<char>>>, std::equal_to<std::pair<const void *, std::basic_string_view<char>>>, std::allocator<std::pair<const std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>>>::dealloc() [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>, Hash = absl::hash_internal::Hash<std::pair<const void *, std::basic_string_view<char>>>, Eq = std::equal_to<std::pair<const void *, std::basic_string_view<char>>>, Alloc = std::allocator<std::pair<const std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>>]"
               );
}

Assistant:

inline void dealloc() {
    ABSL_SWISSTABLE_ASSERT(capacity() != 0);
    // Unpoison before returning the memory to the allocator.
    SanitizerUnpoisonMemoryRegion(slot_array(), sizeof(slot_type) * capacity());
    infoz().Unregister();
    Deallocate<BackingArrayAlignment(alignof(slot_type))>(
        &alloc_ref(), common().backing_array_start(),
        common().alloc_size(sizeof(slot_type), alignof(slot_type)));
  }